

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfd::ConfidentialTransactionController::AddPeginWitness
          (ConfidentialTransactionController *this,Txid *txid,uint32_t vout,Amount *amount,
          ConfidentialAssetId *asset_id,BlockHash *mainchain_genesis_block_hash,Script *claim_script
          ,ByteData *mainchain_pegin_transaction,ByteData *tx_out_proof)

{
  ConfidentialTransactionController *in_RCX;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *in_RDI;
  Txid *in_R8;
  undefined8 in_R9;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> witness_datas;
  value_type *in_stack_ffffffffffffff38;
  value_type *in_stack_ffffffffffffff48;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *in_stack_ffffffffffffff50;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *in_stack_ffffffffffffffc8;
  uint32_t vout_00;
  
  vout_00 = (uint32_t)((ulong)in_R9 >> 0x20);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)0x4106d8);
  cfd::core::Amount::GetByteData();
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
            (in_RDI,in_stack_ffffffffffffff38);
  core::ByteData::~ByteData((ByteData *)0x41070a);
  cfd::core::ConfidentialAssetId::GetUnblindedData();
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
            (in_RDI,in_stack_ffffffffffffff38);
  core::ByteData::~ByteData((ByteData *)0x41073c);
  cfd::core::BlockHash::GetData();
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  core::ByteData::~ByteData((ByteData *)0x41076e);
  cfd::core::Script::GetData();
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  core::ByteData::~ByteData((ByteData *)0x4107a0);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  AddPeginWitness(in_RCX,in_R8,vout_00,in_stack_ffffffffffffffc8);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (in_stack_ffffffffffffff50);
  return;
}

Assistant:

void ConfidentialTransactionController::AddPeginWitness(
    const Txid& txid, uint32_t vout, const Amount& amount,
    const ConfidentialAssetId& asset_id,
    const BlockHash& mainchain_genesis_block_hash, const Script& claim_script,
    const ByteData& mainchain_pegin_transaction,
    const ByteData& tx_out_proof) {
  std::vector<ByteData> witness_datas;
  witness_datas.push_back(amount.GetByteData());
  witness_datas.push_back(asset_id.GetUnblindedData());
  witness_datas.push_back(mainchain_genesis_block_hash.GetData());
  witness_datas.push_back(claim_script.GetData());
  witness_datas.push_back(mainchain_pegin_transaction);
  witness_datas.push_back(tx_out_proof);

  AddPeginWitness(txid, vout, witness_datas);
}